

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O0

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  void *pvVar5;
  ostream *__x;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *this;
  size_type sVar6;
  reference ppDVar7;
  byte in_CL;
  result_type_conflict1 in_EDX;
  long *in_RSI;
  int *in_RDI;
  Device *gpu;
  iterator __end2;
  iterator __begin2;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *__range2;
  int default_index;
  random_device rd;
  istringstream c_1;
  string a2_1;
  istringstream c;
  string a2;
  string arg;
  int argi;
  unsigned_long num_mb;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> gpudevices;
  undefined4 in_stack_ffffffffffffe7e8;
  int in_stack_ffffffffffffe7ec;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe7f0;
  char ***in_stack_ffffffffffffe7f8;
  int *in_stack_ffffffffffffe800;
  random_device *in_stack_ffffffffffffe830;
  undefined1 in_stack_ffffffffffffe84b;
  int in_stack_ffffffffffffe84c;
  Device_CPU *in_stack_ffffffffffffe850;
  __normal_iterator<cnn::Device_**,_std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>_>
  local_1778;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *local_1770;
  int local_1764;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *local_1760;
  int local_3cc;
  istringstream local_3c8 [391];
  allocator local_241;
  string local_240 [32];
  istringstream local_220 [391];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [36];
  int local_3c;
  ulong local_38;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> local_30;
  byte local_15;
  result_type_conflict1 local_14;
  long *local_10;
  int *local_8;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::vector
            ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)0x5eeaf6);
  local_38 = 0x200;
  local_3c = 1;
  do {
    if (*local_8 <= local_3c) break;
    pcVar1 = *(char **)(*local_10 + (long)local_3c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffe7f0,
                            (char *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8));
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe7f0,
                                (char *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8
                                                )), bVar2)) {
      if (*local_8 < local_3c + 1) {
        std::operator<<((ostream *)&std::cerr,
                        "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                       );
        abort();
      }
      in_stack_ffffffffffffe850 = *(Device_CPU **)(*local_10 + 8 + (long)local_3c * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,(char *)in_stack_ffffffffffffe850,&local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::istringstream::istringstream(local_220,local_98,8);
      std::istream::operator>>(local_220,&local_38);
      RemoveArgs(in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,
                 (int *)in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ec);
      std::__cxx11::istringstream::~istringstream(local_220);
      std::__cxx11::string::~string(local_98);
LAB_005eefa6:
      local_3cc = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe7f0,
                              (char *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8))
      ;
      in_stack_ffffffffffffe84c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe84c);
      if (bVar2) {
LAB_005eedc5:
        if (*local_8 < local_3c + 1) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-seed expects an argument (the random number seed)\n");
          abort();
        }
        pcVar1 = *(char **)(*local_10 + 8 + (long)local_3c * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,pcVar1,&local_241);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        std::__cxx11::istringstream::istringstream(local_3c8,local_240,8);
        std::istream::operator>>(local_3c8,&local_14);
        RemoveArgs(in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,
                   (int *)in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ec);
        std::__cxx11::istringstream::~istringstream(local_3c8);
        std::__cxx11::string::~string(local_240);
        goto LAB_005eefa6;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe7f0,
                              (char *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8))
      ;
      in_stack_ffffffffffffe84c =
           CONCAT13((char)((uint)in_stack_ffffffffffffe84c >> 0x18),
                    CONCAT12(bVar2,(short)in_stack_ffffffffffffe84c));
      if (bVar2) goto LAB_005eedc5;
      lVar3 = std::__cxx11::string::find((char *)local_60,0x7cfc1d);
      if (lVar3 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] Bad command line argument: ");
        poVar4 = std::operator<<(poVar4,local_60);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        abort();
      }
      local_3cc = 3;
    }
    std::__cxx11::string::~string(local_60);
  } while (local_3cc == 0);
  if (local_14 == 0) {
    std::random_device::random_device(in_stack_ffffffffffffe830);
    local_14 = std::random_device::operator()((random_device *)0x5ef00a);
    std::random_device::~random_device((random_device *)0x5ef028);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] random seed: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,local_14);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  pvVar5 = operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffe7f0,CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8)
            );
  rndeng = pvVar5;
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] allocating memory: ");
  __x = (ostream *)std::ostream::operator<<(poVar4,local_38);
  std::operator<<(__x,"MB\n");
  this = (vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)operator_new(0x80);
  Device_CPU::Device_CPU
            (in_stack_ffffffffffffe850,in_stack_ffffffffffffe84c,(bool)in_stack_ffffffffffffe84b);
  local_1760 = this;
  std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::push_back
            (this,(value_type *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8));
  local_1764 = 0;
  sVar6 = std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::size(&local_30);
  if (sVar6 != 0) {
    local_1770 = &local_30;
    local_1778._M_current =
         (Device **)
         std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::begin
                   ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)
                    CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8));
    std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::end
              ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)
               CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<cnn::Device_**,_std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>_>
                               *)this,(__normal_iterator<cnn::Device_**,_std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffe7ec,
                                                  in_stack_ffffffffffffe7e8)), bVar2) {
      __gnu_cxx::
      __normal_iterator<cnn::Device_**,_std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>_>
      ::operator*(&local_1778);
      std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::push_back
                ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)poVar4,(value_type *)__x);
      __gnu_cxx::
      __normal_iterator<cnn::Device_**,_std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>_>
      ::operator++(&local_1778);
    }
    local_1764 = local_1764 + 1;
  }
  ppDVar7 = std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::operator[]
                      ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)devices,
                       (long)local_1764);
  default_device = *ppDVar7;
  fxs = default_device->fxs;
  dEdfs = default_device->dEdfs;
  ps = default_device->ps;
  kSCALAR_MINUSONE = default_device->kSCALAR_MINUSONE;
  kSCALAR_ONE = default_device->kSCALAR_ONE;
  kSCALAR_ZERO = default_device->kSCALAR_ZERO;
  std::operator<<((ostream *)&std::cerr,"[cnn] memory allocation done.\n");
  std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::~vector
            ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)poVar4);
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
  vector<Device*> gpudevices;
#if HAVE_CUDA
  cerr << "[cnn] initializing CUDA\n";
  gpudevices = Initialize_GPU(argc, argv);
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  devices.push_back(new Device_CPU(num_mb, shared_parameters));
  int default_index = 0;
  if (gpudevices.size() > 0) {
    for (auto gpu : gpudevices)
      devices.push_back(gpu);
    default_index++;
  }
  default_device = devices[default_index];

  // TODO these should be accessed through the relevant device and removed here
  fxs = default_device->fxs;
  dEdfs = default_device->dEdfs;
  ps = default_device->ps;
  kSCALAR_MINUSONE = default_device->kSCALAR_MINUSONE;
  kSCALAR_ONE = default_device->kSCALAR_ONE;
  kSCALAR_ZERO = default_device->kSCALAR_ZERO;
  cerr << "[cnn] memory allocation done.\n";
}